

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall t_rb_generator::generate_enum(t_rb_generator *this,t_enum *tenum)

{
  undefined1 *puVar1;
  int iVar2;
  t_rb_ofstream *ptVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  t_rb_ofstream *ptVar5;
  pointer pptVar6;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string name;
  _Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ptVar5 = &this->f_types_;
  ptVar3 = t_rb_ofstream::indent(ptVar5);
  poVar4 = std::operator<<((ostream *)ptVar3,"module ");
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  std::__cxx11::string::string((string *)&local_b0,(string *)CONCAT44(extraout_var,iVar2));
  t_generator::capitalize(&local_d0,(t_generator *)this,&local_b0);
  poVar4 = std::operator<<(poVar4,(string *)&local_d0);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  puVar1 = &(this->f_types_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_e8,&tenum->constants_
            );
  for (pptVar6 = local_e8._M_impl.super__Vector_impl_data._M_start;
      pptVar6 != local_e8._M_impl.super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    iVar2 = (*pptVar6)->value_;
    std::__cxx11::string::string((string *)&local_50,(string *)&(*pptVar6)->name_);
    t_generator::capitalize(&local_d0,(t_generator *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    generate_rdoc(this,ptVar5,&(*pptVar6)->super_t_doc);
    ptVar3 = t_rb_ofstream::indent(ptVar5);
    poVar4 = std::operator<<((ostream *)ptVar3,(string *)&local_d0);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  ptVar3 = t_rb_ofstream::indent(ptVar5);
  std::operator<<((ostream *)ptVar3,"VALUE_MAP = {");
  for (pptVar6 = local_e8._M_impl.super__Vector_impl_data._M_start;
      pptVar6 != local_e8._M_impl.super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    iVar2 = (*pptVar6)->value_;
    if (pptVar6 != local_e8._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<((ostream *)ptVar5,", ");
    }
    poVar4 = (ostream *)std::ostream::operator<<(ptVar5,iVar2);
    poVar4 = std::operator<<(poVar4," => \"");
    std::__cxx11::string::string((string *)&local_70,(string *)&(*pptVar6)->name_);
    t_generator::capitalize(&local_d0,(t_generator *)this,&local_70);
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    std::operator<<(poVar4,"\"");
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
  }
  poVar4 = std::operator<<((ostream *)ptVar5,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar3 = t_rb_ofstream::indent(ptVar5);
  std::operator<<((ostream *)ptVar3,"VALID_VALUES = Set.new([");
  for (pptVar6 = local_e8._M_impl.super__Vector_impl_data._M_start;
      pptVar6 != local_e8._M_impl.super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    if (pptVar6 != local_e8._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<((ostream *)ptVar5,", ");
    }
    std::__cxx11::string::string((string *)&local_90,(string *)&(*pptVar6)->name_);
    t_generator::capitalize(&local_d0,(t_generator *)this,&local_90);
    std::operator<<((ostream *)ptVar5,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  poVar4 = std::operator<<((ostream *)ptVar5,"]).freeze");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  puVar1 = &(this->f_types_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  ptVar5 = t_rb_ofstream::indent(ptVar5);
  poVar4 = std::operator<<((ostream *)ptVar5,"end");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base(&local_e8);
  return;
}

Assistant:

void t_rb_generator::generate_enum(t_enum* tenum) {
  f_types_.indent() << "module " << capitalize(tenum->get_name()) << endl;
  f_types_.indent_up();

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    int value = (*c_iter)->get_value();

    // Ruby class constants have to be capitalized... omg i am so on the fence
    // about languages strictly enforcing capitalization why can't we just all
    // agree and play nice.
    string name = capitalize((*c_iter)->get_name());

    generate_rdoc(f_types_, *c_iter);
    f_types_.indent() << name << " = " << value << endl;
  }

  // Create a hash mapping values back to their names (as strings) since ruby has no native enum
  // type
  f_types_.indent() << "VALUE_MAP = {";
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    // Populate the hash
    int value = (*c_iter)->get_value();
    if (c_iter != constants.begin())
      f_types_ << ", ";
    f_types_ << value << " => \"" << capitalize((*c_iter)->get_name()) << "\"";
  }
  f_types_ << "}" << endl;

  // Create a set with valid values for this enum
  f_types_.indent() << "VALID_VALUES = Set.new([";
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    // Populate the set
    if (c_iter != constants.begin())
      f_types_ << ", ";
    f_types_ << capitalize((*c_iter)->get_name());
  }
  f_types_ << "]).freeze" << endl;

  f_types_.indent_down();
  f_types_.indent() << "end" << endl << endl;
}